

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

Section __thiscall
QtPrivate::QCalendarMonthValidator::handleKey(QCalendarMonthValidator *this,int key)

{
  Section SVar1;
  int iVar2;
  int iVar3;
  
  switch(key) {
  case 0x1000012:
  case 0x1000014:
    this->m_pos = 0;
    break;
  case 0x1000013:
    this->m_pos = 0;
    iVar2 = this->m_month + 1;
    if (0xb < this->m_month) {
      iVar2 = 1;
    }
    this->m_month = iVar2;
    return ThisSection;
  case 0x1000015:
    this->m_pos = 0;
    iVar2 = 0xc;
    if (1 < this->m_month) {
      iVar2 = this->m_month + -1;
    }
    this->m_month = iVar2;
    break;
  default:
    if ((key != 0x1000003) && (key != 0x1000061)) {
      SVar1 = ThisSection;
      if (0xfffffff5 < key - 0x3aU) {
        iVar3 = key + -0x30;
        iVar2 = this->m_pos;
        if (iVar2 != 0) {
          iVar3 = iVar3 + this->m_month * 10 + (this->m_month / 10) * -100;
        }
        this->m_month = iVar3;
        if (0xc < iVar3) {
          this->m_month = 0xc;
        }
        SVar1 = (Section)(iVar2 < 1);
        iVar3 = 0;
        if (iVar2 < 1) {
          iVar3 = iVar2 + 1;
        }
        this->m_pos = iVar3;
      }
      return SVar1;
    }
    iVar2 = this->m_pos + -1;
    if (this->m_pos < 1) {
      iVar2 = 1;
    }
    this->m_pos = iVar2;
    if (iVar2 == 0) {
      this->m_month = this->m_oldMonth;
      return PrevSection;
    }
    this->m_month = this->m_month / 10;
    return ThisSection;
  }
  return ThisSection;
}

Assistant:

QCalendarDateSectionValidator::Section QCalendarMonthValidator::handleKey(int key)
{
    if (key == Qt::Key_Right || key == Qt::Key_Left) {
        m_pos = 0;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Up) {
        m_pos = 0;
        ++m_month;
        if (m_month > 12)
            m_month = 1;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Down) {
        m_pos = 0;
        --m_month;
        if (m_month < 1)
            m_month = 12;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Back || key == Qt::Key_Backspace) {
        --m_pos;
        if (m_pos < 0)
            m_pos = 1;

        if (m_pos == 0)
            m_month = m_oldMonth;
        else
            m_month = m_month / 10;
            //m_month = m_oldMonth / 10 * 10 + m_month / 10;

        if (m_pos == 0)
            return QCalendarDateSectionValidator::PrevSection;
        return QCalendarDateSectionValidator::ThisSection;
    }
    if (key < Qt::Key_0 || key > Qt::Key_9)
        return QCalendarDateSectionValidator::ThisSection;
    int pressedKey = key - Qt::Key_0;
    if (m_pos == 0)
        m_month = pressedKey;
    else
        m_month = m_month % 10 * 10 + pressedKey;
    if (m_month > 12)
        m_month = 12;
    ++m_pos;
    if (m_pos > 1) {
        m_pos = 0;
        return QCalendarDateSectionValidator::NextSection;
    }
    return QCalendarDateSectionValidator::ThisSection;
}